

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenerator::InfoT::GetArray
          (InfoT *this,string *key,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,bool required)

{
  bool bVar1;
  Value *this_00;
  string_view message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  char *local_30;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isArray(this_00);
  if ((!bVar1) && (bVar1 = Json::Value::isNull(this_00), !bVar1 || required)) {
    local_48._M_str = (key->_M_dataplus)._M_p;
    local_48._M_len = key->_M_string_length;
    local_38 = 0x11;
    local_30 = " is not an array.";
    views._M_len = 2;
    views._M_array = &local_48;
    cmCatViews_abi_cxx11_(&local_68,views);
    message._M_str = local_68._M_dataplus._M_p;
    message._M_len = local_68._M_string_length;
    LogError(this,this->Gen_->GenType_,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  bVar1 = GetJsonArray(list,this_00);
  return !required || bVar1;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetArray(std::string const& key,
                                        std::unordered_set<std::string>& list,
                                        bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (!jval.isArray()) {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not an array."));
    }
  }
  return GetJsonArray(list, jval) || !required;
}